

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::setLayoutQualifier
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *id)

{
  int *piVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  EShLanguage EVar6;
  ulong uVar7;
  char *pcVar8;
  size_type sVar9;
  TLayoutDepth depth;
  TLayoutDepth d;
  char *pcVar10;
  _func_int *UNRECOVERED_JUMPTABLE;
  TBlendEquationShift e;
  
  pcVar2 = (id->_M_dataplus)._M_p;
  sVar3 = id->_M_string_length;
  for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
    iVar5 = tolower((int)pcVar2[sVar9]);
    pcVar2[sVar9] = (char)iVar5;
  }
  bVar4 = std::operator==(id,"column_major");
  if (bVar4) {
    uVar7 = (*(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff) + 0x2000000000000000;
LAB_00323386:
    *(ulong *)&qualifier->field_0x8 = uVar7;
    return;
  }
  bVar4 = std::operator==(id,"row_major");
  if (bVar4) {
    uVar7 = *(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
    goto LAB_00323386;
  }
  bVar4 = std::operator==(id,"push_constant");
  if (bVar4) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"push_constant");
    qualifier->layoutPushConstant = true;
    return;
  }
  EVar6 = (this->super_TParseContextBase).super_TParseVersions.language;
  if ((EVar6 & ~EShLangTessControl) == EShLangTessEvaluation) {
    bVar4 = std::operator==(id,"triangles");
    if (!bVar4) {
      EVar6 = (this->super_TParseContextBase).super_TParseVersions.language;
      if (EVar6 == EShLangTessEvaluation) {
        bVar4 = std::operator==(id,"triangles");
        if (((((!bVar4) && (bVar4 = std::operator==(id,"quads"), !bVar4)) &&
             (bVar4 = std::operator==(id,"isolines"), !bVar4)) &&
            ((bVar4 = std::operator==(id,"equal_spacing"), !bVar4 &&
             (bVar4 = std::operator==(id,"fractional_even_spacing"), !bVar4)))) &&
           ((bVar4 = std::operator==(id,"fractional_odd_spacing"), !bVar4 &&
            ((bVar4 = std::operator==(id,"cw"), !bVar4 &&
             (bVar4 = std::operator==(id,"ccw"), !bVar4)))))) {
          pcVar10 = "point_mode";
          goto LAB_00323485;
        }
      }
      else {
        if (EVar6 != EShLangGeometry) {
          __assert_fail("language == EShLangTessEvaluation",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                        ,0x1bfb,
                        "void glslang::HlslParseContext::setLayoutQualifier(const TSourceLoc &, TQualifier &, TString &)"
                       );
        }
        bVar4 = std::operator==(id,"points");
        if ((((!bVar4) && (bVar4 = std::operator==(id,"line_strip"), !bVar4)) &&
            (bVar4 = std::operator==(id,"lines"), !bVar4)) &&
           ((bVar4 = std::operator==(id,"lines_adjacency"), !bVar4 &&
            (bVar4 = std::operator==(id,"triangles_adjacency"), !bVar4)))) {
          pcVar10 = "triangle_strip";
LAB_00323485:
          bVar4 = std::operator==(id,pcVar10);
          if (!bVar4) {
            EVar6 = (this->super_TParseContextBase).super_TParseVersions.language;
            goto LAB_00323499;
          }
        }
      }
    }
  }
  else {
LAB_00323499:
    if (EVar6 != EShLangFragment) {
LAB_003235e2:
      pcVar10 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar8 = 
      "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)";
      goto LAB_00323605;
    }
    bVar4 = std::operator==(id,"origin_upper_left");
    if (((!bVar4) && (bVar4 = std::operator==(id,"pixel_center_integer"), !bVar4)) &&
       (bVar4 = std::operator==(id,"early_fragment_tests"), !bVar4)) {
      d = EldAny;
      do {
        if (d == EldCount) {
          e = EBlendMultiply;
          iVar5 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(id,0,0xd,"blend_support");
          if (iVar5 != 0) goto LAB_003235e2;
          goto LAB_00323632;
        }
        pcVar10 = TQualifier::getLayoutDepthString(d);
        bVar4 = std::operator==(id,pcVar10);
        d = d + EldAny;
      } while (!bVar4);
    }
  }
  pcVar10 = (id->_M_dataplus)._M_p;
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
  pcVar8 = "ignored";
LAB_00323605:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar8,pcVar10,"",UNRECOVERED_JUMPTABLE);
  return;
LAB_00323632:
  if (e == EBlendCount) goto code_r0x00323638;
  pcVar10 = TQualifier::getBlendEquationString(e);
  bVar4 = std::operator==(id,pcVar10);
  if (bVar4) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_KHR_blend_equation_advanced,"blend equation");
    piVar1 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->blendEquations;
    *piVar1 = *piVar1 | 1 << ((byte)e & 0x1f);
    pcVar10 = (id->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
    pcVar8 = "ignored";
    goto LAB_00323605;
  }
  e = e + EBlendScreen;
  goto LAB_00323632;
code_r0x00323638:
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar8 = "unknown blend equation";
  pcVar10 = "blend_support";
  goto LAB_00323605;
}

Assistant:

void HlslParseContext::setLayoutQualifier(const TSourceLoc& loc, TQualifier& qualifier, TString& id)
{
    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == TQualifier::getLayoutMatrixString(ElmColumnMajor)) {
        qualifier.layoutMatrix = ElmRowMajor;
        return;
    }
    if (id == TQualifier::getLayoutMatrixString(ElmRowMajor)) {
        qualifier.layoutMatrix = ElmColumnMajor;
        return;
    }
    if (id == "push_constant") {
        requireVulkan(loc, "push_constant");
        qualifier.layoutPushConstant = true;
        return;
    }
    if (language == EShLangGeometry || language == EShLangTessEvaluation) {
        if (id == TQualifier::getGeometryString(ElgTriangles)) {
            // publicType.shaderQualifiers.geometry = ElgTriangles;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (language == EShLangGeometry) {
            if (id == TQualifier::getGeometryString(ElgPoints)) {
                // publicType.shaderQualifiers.geometry = ElgPoints;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLineStrip)) {
                // publicType.shaderQualifiers.geometry = ElgLineStrip;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLines)) {
                // publicType.shaderQualifiers.geometry = ElgLines;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLinesAdjacency)) {
                // publicType.shaderQualifiers.geometry = ElgLinesAdjacency;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgTrianglesAdjacency)) {
                // publicType.shaderQualifiers.geometry = ElgTrianglesAdjacency;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgTriangleStrip)) {
                // publicType.shaderQualifiers.geometry = ElgTriangleStrip;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        } else {
            assert(language == EShLangTessEvaluation);

            // input primitive
            if (id == TQualifier::getGeometryString(ElgTriangles)) {
                // publicType.shaderQualifiers.geometry = ElgTriangles;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgQuads)) {
                // publicType.shaderQualifiers.geometry = ElgQuads;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgIsolines)) {
                // publicType.shaderQualifiers.geometry = ElgIsolines;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // vertex spacing
            if (id == TQualifier::getVertexSpacingString(EvsEqual)) {
                // publicType.shaderQualifiers.spacing = EvsEqual;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalEven)) {
                // publicType.shaderQualifiers.spacing = EvsFractionalEven;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalOdd)) {
                // publicType.shaderQualifiers.spacing = EvsFractionalOdd;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // triangle order
            if (id == TQualifier::getVertexOrderString(EvoCw)) {
                // publicType.shaderQualifiers.order = EvoCw;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexOrderString(EvoCcw)) {
                // publicType.shaderQualifiers.order = EvoCcw;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // point mode
            if (id == "point_mode") {
                // publicType.shaderQualifiers.pointMode = true;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        }
    }
    if (language == EShLangFragment) {
        if (id == "origin_upper_left") {
            // publicType.shaderQualifiers.originUpperLeft = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "pixel_center_integer") {
            // publicType.shaderQualifiers.pixelCenterInteger = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "early_fragment_tests") {
            // publicType.shaderQualifiers.earlyFragmentTests = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        for (TLayoutDepth depth = (TLayoutDepth)(EldNone + 1); depth < EldCount; depth = (TLayoutDepth)(depth + 1)) {
            if (id == TQualifier::getLayoutDepthString(depth)) {
                // publicType.shaderQualifiers.layoutDepth = depth;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        }
        if (id.compare(0, 13, "blend_support") == 0) {
            bool found = false;
            for (TBlendEquationShift be = (TBlendEquationShift)0; be < EBlendCount; be = (TBlendEquationShift)(be + 1)) {
                if (id == TQualifier::getBlendEquationString(be)) {
                    requireExtensions(loc, 1, &E_GL_KHR_blend_equation_advanced, "blend equation");
                    intermediate.addBlendEquation(be);
                    // publicType.shaderQualifiers.blendEquation = true;
                    warn(loc, "ignored", id.c_str(), "");
                    found = true;
                    break;
                }
            }
            if (! found)
                error(loc, "unknown blend equation", "blend_support", "");
            return;
        }
    }
    error(loc, "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)", id.c_str(), "");
}